

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::emplace<int>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos,int *args)

{
  iterator pCVar1;
  reference src;
  int *in_RDX;
  pointer in_RSI;
  SmallVectorBase<(anonymous_namespace)::Constructable> *in_RDI;
  Constructable *in_stack_00000020;
  Constructable *in_stack_00000028;
  Constructable *in_stack_00000030;
  Constructable temp;
  iterator result;
  pointer __result;
  Constructable *in_stack_ffffffffffffff88;
  __move_backward_fn *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  Constructable in_stack_ffffffffffffffd0;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    local_8 = emplaceRealloc<int>((SmallVectorBase<(anonymous_namespace)::Constructable> *)
                                  in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                                  in_stack_ffffffffffffffc0);
  }
  else {
    pCVar1 = end(in_RDI);
    local_8 = in_RSI;
    if (in_RSI == pCVar1) {
      pCVar1 = end(in_RDI);
      anon_unknown.dwarf_70180c::Constructable::Constructable(pCVar1,*in_RDX);
      in_RDI->len = in_RDI->len + 1;
    }
    else {
      anon_unknown.dwarf_70180c::Constructable::Constructable
                ((Constructable *)&stack0xffffffffffffffd0,*in_RDX);
      pCVar1 = end(in_RDI);
      src = back(in_RDI);
      anon_unknown.dwarf_70180c::Constructable::Constructable(pCVar1,src);
      __result = in_RSI;
      pCVar1 = end(in_RDI);
      pCVar1 = pCVar1 + -1;
      end(in_RDI);
      std::ranges::__move_backward_fn::
      operator()<(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,pCVar1,__result);
      anon_unknown.dwarf_70180c::Constructable::operator=(in_stack_00000030,in_stack_00000028);
      in_RDI->len = in_RDI->len + 1;
      anon_unknown.dwarf_70180c::Constructable::~Constructable(in_stack_00000020);
    }
  }
  return local_8;
}

Assistant:

iterator emplace(const_iterator pos, Args&&... args) {
        auto result = const_cast<iterator>(pos);
        if (len == cap)
            return emplaceRealloc(result, std::forward<Args>(args)...);

        if (pos == end()) {
            // Emplace at end can be constructed in place.
            new (end()) T(std::forward<Args>(args)...);
            len++;
            return result;
        }

        // Construct a temporary to avoid aliasing an existing element we're about to move.
        T temp(std::forward<Args>(args)...);

        // Manually move the last element backward by one because it's uninitialized space.
        new (end()) T(std::move(back()));

        // Now move everything else and insert our temporary.
        std::ranges::move_backward(result, end() - 1, end());
        *result = std::move(temp);

        len++;
        return result;
    }